

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O3

int envy_bios_parse_power_budget(envy_bios *bios)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  byte bVar3;
  uint uVar4;
  envy_bios_power_budget_entry *peVar5;
  int iVar6;
  uint uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  
  uVar9 = (bios->power).budget.offset;
  if ((ulong)uVar9 == 0) {
    return -0x16;
  }
  if (uVar9 < bios->length) {
    bVar3 = bios->data[uVar9];
    (bios->power).budget.version = bVar3;
  }
  else {
    (bios->power).budget.version = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    bVar3 = (bios->power).budget.version;
  }
  if ((0x30 < bVar3) || ((0x1000100010000U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
    envy_bios_parse_power_budget_cold_1();
    return -0x16;
  }
  uVar8 = (bios->power).budget.offset;
  uVar9 = uVar8 + 1;
  uVar7 = bios->length;
  if (uVar9 < uVar7) {
    (bios->power).budget.hlen = bios->data[uVar9];
    iVar11 = 0;
  }
  else {
    (bios->power).budget.hlen = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar9);
    uVar8 = (bios->power).budget.offset;
    uVar7 = bios->length;
    iVar11 = -0xe;
  }
  uVar9 = uVar8 + 2;
  if (uVar9 < uVar7) {
    (bios->power).budget.rlen = bios->data[uVar9];
    iVar6 = 0;
  }
  else {
    (bios->power).budget.rlen = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar9);
    uVar8 = (bios->power).budget.offset;
    uVar7 = bios->length;
    iVar6 = -0xe;
  }
  if (uVar8 + 3 < uVar7) {
    (bios->power).budget.entriesnum = bios->data[uVar8 + 3];
    iVar13 = 0;
  }
  else {
    (bios->power).budget.entriesnum = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    iVar13 = -0xe;
  }
  (bios->power).budget.valid = (iVar6 == 0 && iVar11 == 0) && iVar13 == 0;
  uVar1 = (bios->power).budget.version;
  if (uVar1 == ' ') {
    uVar9 = (bios->power).budget.offset + 9;
  }
  else {
    if (uVar1 != '0') goto LAB_0025f31c;
    uVar9 = (bios->power).budget.offset + 10;
  }
  if (uVar9 < bios->length) {
    (bios->power).budget.cap_entry = bios->data[uVar9];
  }
  else {
    (bios->power).budget.cap_entry = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
  }
LAB_0025f31c:
  bVar3 = (bios->power).budget.entriesnum;
  peVar5 = (envy_bios_power_budget_entry *)calloc(1,(ulong)((uint)bVar3 * 8) * 3);
  (bios->power).budget.entries = peVar5;
  if (bVar3 != 0) {
    lVar14 = 0;
    uVar15 = 0;
    uVar9 = 0;
    do {
      iVar6 = (uint)(bios->power).budget.hlen + (bios->power).budget.offset;
      uVar12 = (uint)(bios->power).budget.rlen;
      iVar13 = (int)uVar15 * uVar12;
      iVar11 = iVar6 + iVar13;
      *(int *)((long)&peVar5->offset + lVar14) = iVar11;
      uVar10 = iVar13 + iVar6 + 2;
      uVar7 = iVar6 + iVar13 + 5;
      if (uVar12 == 6) {
        if (uVar7 < bios->length) {
          puVar2 = bios->data;
          *(uint *)((long)&peVar5->avg + lVar14) =
               CONCAT13(puVar2[uVar7],
                        CONCAT12(puVar2[iVar11 + 4],CONCAT11(puVar2[iVar11 + 3],puVar2[uVar10])));
          uVar7 = 0;
        }
        else {
          *(undefined4 *)((long)&peVar5->avg + lVar14) = 0;
          fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
          uVar7 = 0xfffffff2;
        }
      }
      else {
        if (uVar7 < bios->length) {
          puVar2 = bios->data;
          *(uint *)((long)&peVar5->min + lVar14) =
               CONCAT13(puVar2[uVar7],
                        CONCAT12(puVar2[iVar11 + 4],CONCAT11(puVar2[iVar11 + 3],puVar2[uVar10])));
          uVar7 = 0;
        }
        else {
          *(undefined4 *)((long)&peVar5->min + lVar14) = 0;
          fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
          peVar5 = (bios->power).budget.entries;
          uVar7 = 0xfffffff2;
        }
        if (iVar11 + 9U < bios->length) {
          puVar2 = bios->data;
          *(uint *)((long)&peVar5->avg + lVar14) =
               CONCAT13(puVar2[iVar11 + 9U],
                        CONCAT12(puVar2[iVar11 + 8],CONCAT11(puVar2[iVar11 + 7],puVar2[iVar11 + 6]))
                       );
          uVar10 = 0;
        }
        else {
          *(undefined4 *)((long)&peVar5->avg + lVar14) = 0;
          fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
          peVar5 = (bios->power).budget.entries;
          uVar10 = 0xfffffff2;
        }
        if (iVar11 + 0xdU < bios->length) {
          puVar2 = bios->data;
          *(uint *)((long)&peVar5->peak + lVar14) =
               CONCAT13(puVar2[iVar11 + 0xdU],
                        CONCAT12(puVar2[iVar11 + 0xc],
                                 CONCAT11(puVar2[iVar11 + 0xb],puVar2[iVar11 + 10])));
          uVar12 = 0;
        }
        else {
          *(undefined4 *)((long)&peVar5->peak + lVar14) = 0;
          fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
          peVar5 = (bios->power).budget.entries;
          uVar12 = 0xfffffff2;
        }
        if (iVar11 + 0x15U < bios->length) {
          puVar2 = bios->data;
          *(uint *)((long)&peVar5->unkn12 + lVar14) =
               CONCAT13(puVar2[iVar11 + 0x15U],
                        CONCAT12(puVar2[iVar11 + 0x14],
                                 CONCAT11(puVar2[iVar11 + 0x13],puVar2[iVar11 + 0x12])));
          uVar4 = 0;
        }
        else {
          *(undefined4 *)((long)&peVar5->unkn12 + lVar14) = 0;
          fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
          uVar4 = 0xfffffff2;
        }
        uVar7 = uVar7 | uVar10 | uVar12 | uVar4;
      }
      uVar9 = uVar9 | uVar7;
      peVar5 = (bios->power).budget.entries;
      (&peVar5->valid)[lVar14] = uVar9 == 0;
      uVar15 = uVar15 + 1;
      lVar14 = lVar14 + 0x18;
    } while (uVar15 < (bios->power).budget.entriesnum);
  }
  return 0;
}

Assistant:

int envy_bios_parse_power_budget(struct envy_bios *bios) {
	struct envy_bios_power_budget *budget = &bios->power.budget;
	int i, err = 0;

	if (!budget->offset)
		return -EINVAL;

	bios_u8(bios, budget->offset + 0x0, &budget->version);

	switch(budget->version) {
	case 0x10:
	case 0x20:
	case 0x30:
		err |= bios_u8(bios, budget->offset + 0x1, &budget->hlen);
		err |= bios_u8(bios, budget->offset + 0x2, &budget->rlen);
		err |= bios_u8(bios, budget->offset + 0x3, &budget->entriesnum);
		budget->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown POWER BUDGET table version 0x%x\n", budget->version);
		return -EINVAL;
	};

	switch(budget->version) {
	case 0x20:
		err |= bios_u8(bios, budget->offset + 0x9, &budget->cap_entry);
		break;
	case 0x30:
		err |= bios_u8(bios, budget->offset + 0xa, &budget->cap_entry);
		break;
	};

	err = 0;
	budget->entries = malloc(budget->entriesnum * sizeof(struct envy_bios_power_budget_entry));
	memset(budget->entries, 0x0, budget->entriesnum * sizeof(struct envy_bios_power_budget_entry));
	for (i = 0; i < budget->entriesnum; i++) {
		uint32_t data = budget->offset + budget->hlen + i * budget->rlen;

		budget->entries[i].offset = data;

		if (budget->rlen == 0x6) {
			err |= bios_u32(bios, data + 0x02, &budget->entries[i].avg);
		} else {
			err |= bios_u32(bios, data + 0x02, &budget->entries[i].min);
			err |= bios_u32(bios, data + 0x06, &budget->entries[i].avg);
			err |= bios_u32(bios, data + 0x0a, &budget->entries[i].peak);
			err |= bios_u32(bios, data + 0x12, &budget->entries[i].unkn12);
		}

		budget->entries[i].valid = !err;
	}

	return 0;
}